

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_localize_ghost_int(REF_NODE ref_node,REF_INT *scalar)

{
  int iVar1;
  REF_MPI ref_mpi;
  uint uVar2;
  REF_INT *send_size;
  ulong uVar3;
  REF_INT *recv_size;
  void *pvVar4;
  void *recv;
  void *recv_00;
  undefined4 *__ptr;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  REF_INT local;
  void *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  uVar10 = (ulong)ref_mpi->n;
  if ((long)uVar10 < 2) {
    return 0;
  }
  send_size = (REF_INT *)malloc(uVar10 * 4);
  if (send_size == (REF_INT *)0x0) {
    pcVar11 = "malloc a_size of REF_INT NULL";
    uVar9 = 0x4c8;
  }
  else {
    for (uVar3 = 0; uVar3 < uVar10; uVar3 = uVar3 + 1) {
      send_size[uVar3] = 0;
    }
    recv_size = (REF_INT *)malloc(uVar10 * 4);
    if (recv_size == (REF_INT *)0x0) {
      pcVar11 = "malloc b_size of REF_INT NULL";
      uVar9 = 0x4c9;
    }
    else {
      for (uVar3 = 0; uVar3 < uVar10; uVar3 = uVar3 + 1) {
        recv_size[uVar3] = 0;
      }
      uVar3 = 0;
      uVar10 = (ulong)(uint)ref_node->max;
      if (ref_node->max < 1) {
        uVar10 = uVar3;
      }
      for (; uVar10 != uVar3; uVar3 = uVar3 + 1) {
        if ((-1 < ref_node->global[uVar3]) && (ref_mpi->id != ref_node->part[uVar3])) {
          send_size[ref_node->part[uVar3]] = send_size[ref_node->part[uVar3]] + 1;
        }
      }
      uVar2 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x4d2,"ref_node_localize_ghost_int",(ulong)uVar2,"alltoall sizes");
        return uVar2;
      }
      uVar2 = ref_mpi->n;
      uVar10 = 0;
      uVar3 = 0;
      if (0 < (int)uVar2) {
        uVar3 = (ulong)uVar2;
      }
      uVar7 = 0;
      for (; uVar3 != uVar10; uVar10 = uVar10 + 1) {
        uVar7 = (ulong)(uint)((int)uVar7 + send_size[uVar10]);
      }
      if ((int)uVar7 < 0) {
        pcVar11 = "malloc a_global of REF_GLOB negative";
        uVar9 = 0x4d6;
LAB_0016694d:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar9,"ref_node_localize_ghost_int",pcVar11);
        return 1;
      }
      pvVar4 = malloc(uVar7 * 8);
      if (pvVar4 == (void *)0x0) {
        pcVar11 = "malloc a_global of REF_GLOB NULL";
        uVar9 = 0x4d6;
      }
      else {
        local_38 = pvVar4;
        pvVar4 = malloc(uVar7 << 2);
        if (pvVar4 == (void *)0x0) {
          pcVar11 = "malloc a_scalar of REF_INT NULL";
          uVar9 = 0x4d7;
        }
        else {
          uVar8 = 0;
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            uVar8 = uVar8 + recv_size[uVar10];
          }
          if ((int)uVar8 < 0) {
            pcVar11 = "malloc b_global of REF_GLOB negative";
            uVar9 = 0x4db;
            goto LAB_0016694d;
          }
          uVar10 = (ulong)uVar8;
          recv = malloc(uVar10 * 8);
          if (recv == (void *)0x0) {
            pcVar11 = "malloc b_global of REF_GLOB NULL";
            uVar9 = 0x4db;
          }
          else {
            recv_00 = malloc(uVar10 * 4);
            if (recv_00 == (void *)0x0) {
              pcVar11 = "malloc b_scalar of REF_INT NULL";
              uVar9 = 0x4dc;
            }
            else {
              if ((int)uVar2 < 0) {
                pcVar11 = "malloc a_next of REF_INT negative";
                uVar9 = 0x4de;
                goto LAB_0016694d;
              }
              __ptr = (undefined4 *)malloc((ulong)uVar2 * 4);
              if (__ptr != (undefined4 *)0x0) {
                *__ptr = 0;
                iVar6 = 0;
                for (uVar3 = 1; uVar3 < uVar2; uVar3 = uVar3 + 1) {
                  iVar6 = iVar6 + send_size[uVar3 - 1];
                  __ptr[uVar3] = iVar6;
                }
                uVar7 = 0;
                uVar3 = (ulong)(uint)ref_node->max;
                if (ref_node->max < 1) {
                  uVar3 = uVar7;
                }
                for (; uVar3 != uVar7; uVar7 = uVar7 + 1) {
                  if ((-1 < ref_node->global[uVar7]) &&
                     (iVar6 = ref_node->part[uVar7], ref_node->ref_mpi->id != iVar6)) {
                    iVar1 = __ptr[iVar6];
                    *(REF_GLOB *)((long)local_38 + (long)iVar1 * 8) = ref_node->global[uVar7];
                    *(REF_INT *)((long)pvVar4 + (long)iVar1 * 4) = scalar[uVar7];
                    __ptr[iVar6] = iVar1 + 1;
                  }
                }
                uVar2 = ref_mpi_alltoallv(ref_mpi,local_38,send_size,recv,recv_size,1,2);
                if (uVar2 == 0) {
                  uVar2 = ref_mpi_alltoallv(ref_mpi,pvVar4,send_size,recv_00,recv_size,1,1);
                  if (uVar2 == 0) {
                    uVar3 = 0;
                    while( true ) {
                      if (uVar10 == uVar3) {
                        for (lVar5 = 0; lVar5 < ref_node->max; lVar5 = lVar5 + 1) {
                          if ((-1 < ref_node->global[lVar5]) &&
                             (ref_node->ref_mpi->id != ref_node->part[lVar5])) {
                            scalar[lVar5] = 0;
                          }
                        }
                        free(__ptr);
                        free(recv_00);
                        free(recv);
                        free(pvVar4);
                        free(local_38);
                        free(recv_size);
                        free(send_size);
                        return 0;
                      }
                      uVar2 = ref_node_local(ref_node,*(REF_GLOB *)((long)recv + uVar3 * 8),&local);
                      if (uVar2 != 0) break;
                      scalar[local] = scalar[local] + *(int *)((long)recv_00 + uVar3 * 4);
                      uVar3 = uVar3 + 1;
                    }
                    uVar10 = (ulong)uVar2;
                    pcVar11 = "g2l";
                    uVar9 = 0x4f6;
                  }
                  else {
                    uVar10 = (ulong)uVar2;
                    pcVar11 = "alltoallv scalar";
                    uVar9 = 0x4f3;
                  }
                }
                else {
                  uVar10 = (ulong)uVar2;
                  pcVar11 = "alltoallv global";
                  uVar9 = 0x4ef;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,uVar9,"ref_node_localize_ghost_int",uVar10,pcVar11);
                return (REF_STATUS)uVar10;
              }
              pcVar11 = "malloc a_next of REF_INT NULL";
              uVar9 = 0x4de;
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar9,
         "ref_node_localize_ghost_int",pcVar11);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_localize_ghost_int(REF_NODE ref_node,
                                               REF_INT *scalar) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_GLOB *a_global, *b_global;
  REF_INT part, node;
  REF_INT *a_next;
  REF_INT *a_scalar, *b_scalar;
  REF_INT local;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      a_size[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_global, a_total, REF_GLOB);
  ref_malloc(a_scalar, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_global, b_total, REF_GLOB);
  ref_malloc(b_scalar, b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_scalar[a_next[part]] = scalar[node];
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_size, b_global, b_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");

  RSS(ref_mpi_alltoallv(ref_mpi, a_scalar, a_size, b_scalar, b_size, 1,
                        REF_INT_TYPE),
      "alltoallv scalar");

  for (node = 0; node < b_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    scalar[local] += b_scalar[node];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      scalar[node] = 0;
    }
  }

  free(a_next);
  free(b_scalar);
  free(b_global);
  free(a_scalar);
  free(a_global);
  free(b_size);
  free(a_size);

  return REF_SUCCESS;
}